

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O2

CoverageBinSymbol *
slang::ast::CoverageBinSymbol::fromSyntax(Scope *scope,CoverageBinsSyntax *syntax)

{
  TokenKind TVar1;
  Compilation *this;
  CoverageBinInitializerSyntax *pCVar2;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  BinKind BVar3;
  CoverageBinSymbol *this_00;
  SourceLocation local_40;
  string_view local_38;
  
  this = scope->compilation;
  local_38 = parsing::Token::valueText(&syntax->name);
  local_40 = parsing::Token::location(&syntax->name);
  this_00 = BumpAllocator::
            emplace<slang::ast::CoverageBinSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                      (&this->super_BumpAllocator,&local_38,&local_40);
  (this_00->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  syntax_00._M_ptr =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  syntax_00._M_extent._M_extent_value =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
       _M_extent_value;
  Symbol::setAttributes(&this_00->super_Symbol,scope,syntax_00);
  this_00->isWildcard = (syntax->wildcard).kind == WildcardKeyword;
  TVar1 = (syntax->keyword).kind;
  if (TVar1 == IgnoreBinsKeyword) {
    BVar3 = IgnoreBins;
  }
  else {
    if (TVar1 != IllegalBinsKeyword) goto LAB_0020f232;
    BVar3 = IllegalBins;
  }
  this_00->binsKind = BVar3;
LAB_0020f232:
  if (syntax->size != (CoverageBinsArraySizeSyntax *)0x0) {
    this_00->isArray = true;
  }
  pCVar2 = (syntax->initializer).ptr;
  if (((pCVar2->super_SyntaxNode).kind == DefaultCoverageBinInitializer) &&
     (this_00->isDefault = true, *(long *)&pCVar2[2].super_SyntaxNode != 0)) {
    this_00->isDefaultSequence = true;
  }
  return this_00;
}

Assistant:

CoverageBinSymbol& CoverageBinSymbol::fromSyntax(const Scope& scope,
                                                 const CoverageBinsSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto result = comp.emplace<CoverageBinSymbol>(syntax.name.valueText(), syntax.name.location());
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);

    result->isWildcard = syntax.wildcard.kind == TokenKind::WildcardKeyword;

    if (syntax.keyword.kind == TokenKind::IgnoreBinsKeyword)
        result->binsKind = IgnoreBins;
    else if (syntax.keyword.kind == TokenKind::IllegalBinsKeyword)
        result->binsKind = IllegalBins;

    if (syntax.size)
        result->isArray = true;

    if (syntax.initializer->kind == SyntaxKind::DefaultCoverageBinInitializer) {
        result->isDefault = true;
        if (syntax.initializer->as<DefaultCoverageBinInitializerSyntax>().sequenceKeyword)
            result->isDefaultSequence = true;
    }

    return *result;
}